

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

void __thiscall tinyxml2::XMLDocument::Parse(XMLDocument *this)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  uchar *pu;
  char *pcVar1;
  char cVar2;
  
  this->_parseCurLineNum = 1;
  (this->super_XMLNode)._parseLineNum = 1;
  pcVar1 = XMLUtil::SkipWhiteSpace(this->_charBuffer,&this->_parseCurLineNum);
  this->_writeBOM = false;
  cVar2 = *pcVar1;
  if (cVar2 == -0x11) {
    if ((pcVar1[1] != -0x45) || (pcVar1[2] != -0x41)) goto LAB_00146087;
    this->_writeBOM = true;
    cVar2 = pcVar1[3];
    pcVar1 = pcVar1 + 3;
  }
  if (cVar2 == '\0') {
    SetError(this,XML_ERROR_EMPTY_DOCUMENT,0,(char *)0x0);
    return;
  }
LAB_00146087:
  UNRECOVERED_JUMPTABLE = (this->super_XMLNode)._vptr_XMLNode[0x11];
  (*UNRECOVERED_JUMPTABLE)(this,pcVar1,0,&this->_parseCurLineNum,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void XMLDocument::Parse()
{
    TIXMLASSERT(NoChildren()); // Clear() must have been called previously
    TIXMLASSERT(_charBuffer);
    _parseCurLineNum = 1;
    _parseLineNum = 1;
    char* p = _charBuffer;
    p = XMLUtil::SkipWhiteSpace(p, &_parseCurLineNum);
    p = const_cast<char*>(XMLUtil::ReadBOM(p, &_writeBOM));
    if (!*p) {
        SetError(XML_ERROR_EMPTY_DOCUMENT, 0, 0);
        return;
    }
    ParseDeep(p, 0, &_parseCurLineNum);
}